

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall kratos::FSMState::check_outputs(FSMState *this)

{
  _Rb_tree_header *p_Var1;
  FSM *pFVar2;
  ulong uVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  ulong uVar6;
  undefined1 auVar7 [8];
  __buckets_ptr pp_Var8;
  _Base_ptr p_Var9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar10;
  _Rb_tree_node_base *p_Var11;
  VarException *pVVar12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  ulong uVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long *plVar16;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  undefined1 local_d8 [8];
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  outputs;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_98;
  string local_78;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var_*const,_kratos::Var_*>,_false>_>_>
  _Stack_58;
  __alloc_node_gen_t __alloc_node_gen;
  allocator_type local_31;
  
  pFVar2 = this->parent_;
  _Stack_58._M_h = (__hashtable_alloc *)local_d8;
  local_d8 = (undefined1  [8])0x0;
  outputs._M_h._M_buckets = (__buckets_ptr)(pFVar2->outputs_)._M_h._M_bucket_count;
  outputs._M_h._M_bucket_count = 0;
  outputs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)(pFVar2->outputs_)._M_h._M_element_count;
  outputs._M_h._M_element_count = *(size_type *)&(pFVar2->outputs_)._M_h._M_rehash_policy;
  outputs._M_h._M_rehash_policy._0_8_ = (pFVar2->outputs_)._M_h._M_rehash_policy._M_next_resize;
  outputs._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  _Hashtable<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var*const,kratos::Var*>,false>>>>
            ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)_Stack_58._M_h,&(pFVar2->outputs_)._M_h,&stack0xffffffffffffffa8);
  if (outputs._M_h._M_bucket_count != 0) {
    p_Var1 = &(this->output_values_)._M_t._M_impl.super__Rb_tree_header;
    plVar16 = (long *)outputs._M_h._M_bucket_count;
    do {
      p_Var13 = (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &p_Var1->_M_header;
      if (p_Var13 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var13 + 1) >= (ulong)plVar16[1]) {
            p_Var9 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < (ulong)plVar16[1]];
        } while (p_Var13 != (_Base_ptr)0x0);
      }
      p_Var14 = p_Var1;
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var14 = (_Rb_tree_header *)p_Var9,
         (ulong)plVar16[1] < ((_Rb_tree_header *)p_Var9)->_M_node_count)) {
        p_Var14 = p_Var1;
      }
      if (p_Var14 == p_Var1) {
        if (plVar16[2] == 0) {
          pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
          (**(code **)(*(long *)plVar16[1] + 0xf8))(&local_78);
          local_98.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._M_dataplus._M_p;
          local_98.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._M_string_length;
          format_str_00.size_ = 0xd;
          format_str_00.data_ = (char *)0x11;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&stack0xffffffffffffffa8,(detail *)"{0} not specified",format_str_00,
                     args_00);
          outputs._M_h._M_single_bucket = (__node_base_ptr)plVar16[1];
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&outputs._M_h._M_single_bucket;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_98,__l_00,&local_31);
          VarException::VarException(pVVar12,(string *)&stack0xffffffffffffffa8,&local_98);
          __cxa_throw(pVVar12,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(plVar16[1] + 0x68));
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(plVar16[2] + 0x68));
        output(this,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffa8,
               (shared_ptr<kratos::Var> *)&local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
        if (__alloc_node_gen._M_h != (__hashtable_alloc *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__alloc_node_gen._M_h);
        }
      }
      plVar16 = (long *)*plVar16;
    } while (plVar16 != (long *)0x0);
  }
  pp_Var8 = outputs._M_h._M_buckets;
  auVar7 = local_d8;
  p_Var11 = (this->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var11 == &(this->output_values_)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_d8);
      return;
    }
    uVar3 = *(ulong *)(p_Var11 + 1);
    uVar15 = uVar3 % (ulong)pp_Var8;
    aVar4 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
             )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                *)((long)auVar7 + uVar15 * 8))->values_;
    aVar10.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
    if ((aVar4.values_ !=
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0)
       && (aVar5.values_ =
                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)((aVar4.values_)->field_0).named_args.data, aVar10 = aVar4,
          uVar3 != ((aVar5.values_)->field_0).string.size)) {
      while (in_R9 = aVar5,
            aVar5.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)((in_R9.values_)->field_0).named_args.data,
            (named_arg_info<char> *)aVar5.values_ != (named_arg_info<char> *)0x0) {
        uVar6 = ((aVar5.values_)->field_0).string.size;
        aVar10.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0;
        if ((uVar6 % (ulong)pp_Var8 != uVar15) || (aVar10 = in_R9, uVar3 == uVar6))
        goto LAB_001da89d;
      }
      aVar10.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0;
    }
LAB_001da89d:
    if ((aVar10.values_ ==
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0)
       || (((aVar10.values_)->field_0).long_long_value == 0)) {
      pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
      (**(code **)(**(long **)(p_Var11 + 1) + 0xf8))(&local_98);
      _Stack_58._M_h =
           (__hashtable_alloc *)
           local_98.
           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      __alloc_node_gen._M_h =
           (__hashtable_alloc *)
           local_98.
           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0x1f;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_78,(detail *)"{0} is not specified in FSM {1}",format_str,args);
      outputs._M_h._M_single_bucket = *(__node_base_ptr *)(p_Var11 + 1);
      __l._M_len = 1;
      __l._M_array = (iterator)&outputs._M_h._M_single_bucket;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &stack0xffffffffffffffa8,__l,&local_31);
      VarException::VarException
                (pVVar12,&local_78,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &stack0xffffffffffffffa8);
      __cxa_throw(pVVar12,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
  } while( true );
}

Assistant:

void FSMState::check_outputs() {
    auto outputs = parent_->outputs();
    for (auto const& [output, default_] : outputs) {
        if (output_values_.find(output) == output_values_.end()) {
            if (!default_) {
                throw VarException(::format("{0} not specified", output->to_string()), {output});
            } else {
                // insert it to the output values
                this->output(output->shared_from_this(), default_->shared_from_this());
            }
        }
    }
    // the other way, this is to ensure a bijection
    for (auto const& iter : output_values_) {
        auto const& output = iter.first;
        if (outputs.find(output) == outputs.end()) {
            throw VarException(::format("{0} is not specified in FSM {1}", output->to_string(),
                                        parent_->fsm_name()),
                               {output});
        }
    }
}